

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  bool bVar1;
  int iVar2;
  internals *piVar3;
  cast_error *this;
  reference pp_Var4;
  value_type p_Var5;
  handle *this_00;
  PyObject *pPVar6;
  PyObject **ppPVar7;
  int result;
  value_type *list_ptr;
  vector<_object_*,_std::allocator<_object_*>_> *stack;
  handle h_local;
  
  stack = (vector<_object_*,_std::allocator<_object_*>_> *)h.m_ptr;
  piVar3 = get_internals();
  bVar1 = std::vector<_object_*,_std::allocator<_object_*>_>::empty(&piVar3->loader_patient_stack);
  if (bVar1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error
              (this,
               "When called outside a bound function, py::cast() cannot do Python -> C++ conversions which require the creation of temporary values"
              );
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  pp_Var4 = std::vector<_object_*,_std::allocator<_object_*>_>::back(&piVar3->loader_patient_stack);
  if (*pp_Var4 == (value_type)0x0) {
    p_Var5 = (value_type)PyList_New(1);
    *pp_Var4 = p_Var5;
    if (*pp_Var4 == (value_type)0x0) {
      pybind11_fail("loader_life_support: error allocating list");
    }
    this_00 = handle::inc_ref((handle *)&stack);
    pPVar6 = handle::ptr(this_00);
    iVar2 = PyType_HasFeature((*pp_Var4)->ob_type,0x2000000);
    if (iVar2 == 0) {
      __assert_fail("PyList_Check(list_ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Neyn[P]neynpy/src/pybind11/include/pybind11/cast.h"
                    ,0x50,"static void pybind11::detail::loader_life_support::add_patient(handle)");
    }
    (((*pp_Var4)[1].ob_type)->ob_base).ob_base.ob_refcnt = (Py_ssize_t)pPVar6;
  }
  else {
    p_Var5 = *pp_Var4;
    ppPVar7 = handle::ptr((handle *)&stack);
    iVar2 = PyList_Append(p_Var5,*ppPVar7);
    if (iVar2 == -1) {
      pybind11_fail("loader_life_support: error adding patient");
    }
  }
  return;
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");

        auto &list_ptr = stack.back();
        if (list_ptr == nullptr) {
            list_ptr = PyList_New(1);
            if (!list_ptr)
                pybind11_fail("loader_life_support: error allocating list");
            PyList_SET_ITEM(list_ptr, 0, h.inc_ref().ptr());
        } else {
            auto result = PyList_Append(list_ptr, h.ptr());
            if (result == -1)
                pybind11_fail("loader_life_support: error adding patient");
        }
    }